

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.h
# Opt level: O1

QPoint __thiscall QMouseEvent::pos(QMouseEvent *this)

{
  ulong uVar1;
  undefined4 extraout_EDX;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  
  dVar4 = (double)QEventPoint::position();
  auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar6._8_8_ = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
  auVar6 = minpd(_DAT_0066f5d0,auVar6);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar2 = movmskpd(extraout_EDX,auVar5);
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar3 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
  }
  uVar1 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar1 = (ulong)(uint)(int)auVar6._8_8_;
  }
  return (QPoint)(uVar1 | uVar3);
}

Assistant:

inline QPoint pos() const { return position().toPoint(); }